

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
          (InternalMetadata *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  void *pvVar3;
  
  uVar1 = this->ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) &&
     (pvVar3 = (void *)(uVar1 & 0xfffffffffffffffc), pvVar3 != (void *)0x0)) {
    if (*(long **)((long)pvVar3 + 8) != (long *)((long)pvVar3 + 0x18)) {
      operator_delete(*(long **)((long)pvVar3 + 8),*(long *)((long)pvVar3 + 0x18) + 1);
    }
    operator_delete(pvVar3,0x28);
    return;
  }
  return;
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }